

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

LZ4_stream_t * duckdb_lz4::LZ4_initStream(void *buffer,size_t size)

{
  int iVar1;
  size_t alignment;
  ulong in_RSI;
  LZ4_stream_t *in_RDI;
  undefined8 local_8;
  
  if (in_RDI == (LZ4_stream_t *)0x0) {
    local_8 = (LZ4_stream_t *)0x0;
  }
  else if (in_RSI < 0x4020) {
    local_8 = (LZ4_stream_t *)0x0;
  }
  else {
    alignment = LZ4_stream_t_alignment();
    iVar1 = LZ4_isAligned(in_RDI,alignment);
    if (iVar1 == 0) {
      local_8 = (LZ4_stream_t *)0x0;
    }
    else {
      memset(in_RDI,0,0x4020);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

LZ4_stream_t* LZ4_initStream (void* buffer, size_t size)
{
    DEBUGLOG(5, "LZ4_initStream");
    if (buffer == NULL) { return NULL; }
    if (size < sizeof(LZ4_stream_t)) { return NULL; }
    if (!LZ4_isAligned(buffer, LZ4_stream_t_alignment())) return NULL;
    MEM_INIT(buffer, 0, sizeof(LZ4_stream_t_internal));
    return (LZ4_stream_t*)buffer;
}